

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

void __thiscall
capnp::compiler::ModuleLoader::Impl::addImportPath(Impl *this,ReadableDirectory *dir)

{
  ReadableDirectory *local_20;
  ReadableDirectory *local_18;
  ReadableDirectory *dir_local;
  Impl *this_local;
  
  local_20 = dir;
  local_18 = dir;
  dir_local = (ReadableDirectory *)this;
  kj::Vector<kj::ReadableDirectory_const*>::add<kj::ReadableDirectory_const*>
            ((Vector<kj::ReadableDirectory_const*> *)&this->searchPath,&local_20);
  return;
}

Assistant:

void addImportPath(const kj::ReadableDirectory& dir) {
    searchPath.add(&dir);
  }